

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeData.cpp
# Opt level: O2

string * __thiscall
TPZShapeData::ShapeFunctionType_abi_cxx11_(string *__return_storage_ptr__,TPZShapeData *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch(this->fShapeType) {
  case EEmpty:
    __s = "NotInitialized";
    __a = &local_11;
    break;
  case EScalarShape:
    __s = "Scalar";
    __a = &local_12;
    break;
  case EVecandShape:
    __s = "Vector combined with Scalar";
    __a = &local_13;
    break;
  case EVecShape:
    __s = "Vector shape";
    __a = &local_14;
    break;
  default:
    std::operator<<((ostream *)&std::cerr,"std::string TPZShapeData::ShapeFunctionType() const");
    std::operator<<((ostream *)&std::cerr,"Invalid value\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeData.cpp"
               ,0x18);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string TPZShapeData::ShapeFunctionType() const
{
    switch(fShapeType){
        case EEmpty:
            return "NotInitialized";
        case EScalarShape:
            return "Scalar";
        case EVecandShape:
            return "Vector combined with Scalar";
        case EVecShape:
            return "Vector shape";
        default:
            PZError<<__PRETTY_FUNCTION__;
            PZError<<"Invalid value\n";
            DebugStop();
    }
    return "All Wrong!\n";
}